

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcuRasterizationVerifier.cpp
# Opt level: O1

CoverageType
tcu::calculateTriangleCoverage
          (Vec4 *p0,Vec4 *p1,Vec4 *p2,IVec2 *pixel,IVec2 *viewportSize,int subpixelBits,
          bool multisample)

{
  int iVar1;
  int iVar2;
  byte bVar3;
  CoverageType CVar4;
  bool bVar5;
  int i_19;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  undefined1 **ppuVar9;
  byte bVar10;
  CoverageType CVar11;
  long lVar12;
  ulong *puVar13;
  CoverageType CVar14;
  CoverageType CVar15;
  ulong uVar16;
  Vec4 *pVVar17;
  uint uVar18;
  long *plVar19;
  int i_13;
  int i_12;
  ulong uVar20;
  long lVar21;
  long *plVar22;
  int i_11;
  long lVar23;
  long lVar24;
  ulong uVar25;
  bool bVar26;
  uint uVar27;
  float fVar28;
  float fVar29;
  float fVar30;
  float fVar31;
  float fVar32;
  float fVar33;
  Vector<float,_2> res_4;
  Vector<float,_2> res_3;
  I64Vec2 v1;
  I64Vec2 startPos;
  Vec2 triangleScreenSpace [3];
  I64Vec2 edge;
  Vector<float,_2> res_6;
  I64Vec2 v;
  Vec2 triangleNormalizedDeviceSpace [3];
  Vector<float,_2> res_5;
  Vector<float,_2> res_1;
  Vector<float,_2> res;
  ulong local_268 [2];
  long local_258 [2];
  undefined1 *local_248;
  long lStack_240;
  undefined8 local_238;
  ulong local_230;
  float local_228 [8];
  undefined1 *local_208;
  ulong auStack_200 [4];
  long local_1e0;
  undefined1 *local_1d8;
  ulong local_1d0;
  undefined8 local_1c8;
  ulong auStack_1c0 [4];
  long local_1a0;
  float local_198 [4];
  float local_188;
  float local_184;
  ulong local_178;
  ulong local_170;
  float local_168 [4];
  undefined1 local_158 [16];
  undefined1 local_148 [16];
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  undefined1 local_108 [16];
  ulong local_f0;
  ulong local_e8;
  ulong *local_e0;
  ulong *local_d8;
  undefined1 **local_d0;
  undefined1 **local_c8;
  undefined1 *local_c0;
  long local_b8 [4];
  long local_98;
  long local_90;
  long local_88;
  long local_80;
  long local_78 [4];
  long local_58;
  long local_50;
  long local_48;
  long local_40;
  
  bVar3 = (byte)subpixelBits;
  auStack_1c0[0] = 1L << (bVar3 & 0x3f);
  local_198[0] = p0->m_data[0] / p0->m_data[3];
  local_198[1] = p0->m_data[1] / p0->m_data[3];
  pVVar17 = p1;
  if (0.0 < (p2->m_data[1] / p2->m_data[3] - local_198[1]) *
            (p1->m_data[0] / p1->m_data[3] - local_198[0]) -
            (p2->m_data[0] / p2->m_data[3] - local_198[0]) *
            (p1->m_data[1] / p1->m_data[3] - local_198[1])) {
    pVVar17 = p2;
    p2 = p1;
  }
  local_198[2] = p2->m_data[0] / p2->m_data[3];
  local_198[3] = p2->m_data[1] / p2->m_data[3];
  local_188 = pVVar17->m_data[0] / pVVar17->m_data[3];
  local_184 = pVVar17->m_data[1] / pVVar17->m_data[3];
  local_208 = &DAT_3f8000003f800000;
  local_78[0] = 0;
  lVar12 = 0;
  do {
    *(float *)((long)local_78 + lVar12 * 4) =
         local_198[lVar12] + *(float *)((long)&local_208 + lVar12 * 4);
    lVar12 = lVar12 + 1;
  } while (lVar12 == 1);
  local_b8[0] = 0;
  lVar12 = 0;
  do {
    *(float *)((long)local_b8 + lVar12 * 4) = *(float *)((long)local_78 + lVar12 * 4) * 0.5;
    lVar12 = lVar12 + 1;
  } while (lVar12 == 1);
  local_168[2] = (float)viewportSize->m_data[0];
  local_168[3] = (float)viewportSize->m_data[1];
  local_1c8 = CONCAT44(local_168[3],local_168[2]);
  local_228[0] = 0.0;
  local_228[1] = 0.0;
  lVar12 = 0;
  do {
    local_228[lVar12] =
         *(float *)((long)local_b8 + lVar12 * 4) * *(float *)((long)&local_1c8 + lVar12 * 4);
    lVar12 = lVar12 + 1;
  } while (lVar12 == 1);
  uVar8 = 4;
  if (multisample) {
    uVar8 = auStack_1c0[0];
  }
  local_248 = &DAT_3f8000003f800000;
  local_258[0] = 0;
  lVar12 = 0;
  do {
    *(float *)((long)local_258 + lVar12 * 4) =
         local_198[lVar12 + 2] + *(float *)((long)&local_248 + lVar12 * 4);
    lVar12 = lVar12 + 1;
  } while (lVar12 == 1);
  local_268[0] = 0;
  lVar12 = 0;
  do {
    *(float *)((long)local_268 + lVar12 * 4) = *(float *)((long)local_258 + lVar12 * 4) * 0.5;
    lVar12 = lVar12 + 1;
  } while (lVar12 == 1);
  local_238 = (undefined1 *)CONCAT44(local_168[3],local_168[2]);
  local_228[2] = 0.0;
  local_228[3] = 0.0;
  lVar12 = 0;
  do {
    local_228[lVar12 + 2] =
         *(float *)((long)local_268 + lVar12 * 4) * *(float *)((long)&local_238 + lVar12 * 4);
    lVar12 = lVar12 + 1;
  } while (lVar12 == 1);
  local_c0 = &DAT_3f8000003f800000;
  local_168[0] = 0.0;
  local_168[1] = 0.0;
  lVar12 = 0;
  do {
    local_168[lVar12] = local_198[lVar12 + 4] + *(float *)((long)&local_c0 + lVar12 * 4);
    lVar12 = lVar12 + 1;
  } while (lVar12 == 1);
  local_1d8 = (undefined1 *)0x0;
  lVar12 = 0;
  do {
    *(float *)((long)&local_1d8 + lVar12 * 4) = local_168[lVar12] * 0.5;
    lVar12 = lVar12 + 1;
  } while (lVar12 == 1);
  local_228[4] = 0.0;
  local_228[5] = 0.0;
  lVar12 = 0;
  do {
    local_228[lVar12 + 4] = *(float *)((long)&local_1d8 + lVar12 * 4) * local_168[lVar12 + 2];
    lVar12 = lVar12 + 1;
  } while (lVar12 == 1);
  fVar31 = (float)(~-(uint)(local_228[2] <= local_228[0]) & (uint)local_228[2] |
                  -(uint)(local_228[2] <= local_228[0]) & (uint)local_228[0]);
  uVar27 = -(uint)(local_228[4] <= fVar31);
  iVar1 = pixel->m_data[0];
  CVar11 = COVERAGE_NONE;
  if (((float)iVar1 <= (float)(~uVar27 & (uint)local_228[4] | uVar27 & (uint)fVar31) + 1.0) &&
     (fVar31 = (float)(~-(uint)(local_228[0] <= local_228[2]) & (uint)local_228[2] |
                      -(uint)(local_228[0] <= local_228[2]) & (uint)local_228[0]),
     uVar27 = -(uint)(fVar31 <= local_228[4]),
     (float)(~uVar27 & (uint)local_228[4] | uVar27 & (uint)fVar31) + -1.0 <= (float)iVar1)) {
    fVar31 = (float)(~-(uint)(local_228[3] <= local_228[1]) & (uint)local_228[3] |
                    -(uint)(local_228[3] <= local_228[1]) & (uint)local_228[1]);
    uVar27 = -(uint)(local_228[5] <= fVar31);
    iVar2 = pixel->m_data[1];
    if (((float)iVar2 <= (float)(~uVar27 & (uint)local_228[5] | uVar27 & (uint)fVar31) + 1.0) &&
       (fVar31 = (float)(~-(uint)(local_228[1] <= local_228[3]) & (uint)local_228[3] |
                        -(uint)(local_228[1] <= local_228[3]) & (uint)local_228[1]),
       uVar27 = -(uint)(fVar31 <= local_228[5]),
       (float)(~uVar27 & (uint)local_228[5] | uVar27 & (uint)fVar31) + -1.0 <= (float)iVar2)) {
      local_208 = (undefined1 *)(long)iVar1;
      auStack_200[0] = (long)iVar2;
      local_1c8 = auStack_1c0[0];
      local_b8[0] = 0;
      local_b8[1] = 0;
      lVar12 = 0;
      do {
        local_b8[lVar12] = (&local_1c8)[lVar12] * (long)(&local_208)[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      local_268[0] = auStack_1c0[0] >> 1;
      local_268[1] = local_268[0];
      local_78[0] = 0;
      local_78[1] = 0;
      lVar12 = 0;
      do {
        local_78[lVar12] = local_268[lVar12] + local_b8[lVar12];
        lVar12 = lVar12 + 1;
      } while (lVar12 == 1);
      fVar31 = (float)auStack_1c0[0];
      fVar28 = local_228[0] * fVar31;
      fVar33 = local_228[1] * fVar31;
      plVar19 = local_b8;
      local_b8[0] = (long)(int)((float)(~-(uint)(fVar28 < 0.0) & 0x3f000000 |
                                       -(uint)(fVar28 < 0.0) & 0xbf000000) + fVar28);
      local_b8[1] = (long)(int)((float)(~-(uint)(fVar33 < 0.0) & 0x3f000000 |
                                       -(uint)(fVar33 < 0.0) & 0xbf000000) + fVar33);
      fVar30 = local_228[2] * fVar31;
      fVar32 = local_228[3] * fVar31;
      local_b8[2] = (long)(int)((float)(~-(uint)(fVar30 < 0.0) & 0x3f000000 |
                                       -(uint)(fVar30 < 0.0) & 0xbf000000) + fVar30);
      local_b8[3] = (long)(int)((float)(~-(uint)(fVar32 < 0.0) & 0x3f000000 |
                                       -(uint)(fVar32 < 0.0) & 0xbf000000) + fVar32);
      fVar29 = local_228[4] * fVar31;
      fVar31 = local_228[5] * fVar31;
      local_98 = (long)(int)((float)(~-(uint)(fVar29 < 0.0) & 0x3f000000 |
                                    -(uint)(fVar29 < 0.0) & 0xbf000000) + fVar29);
      local_90 = (long)(int)((float)(~-(uint)(fVar31 < 0.0) & 0x3f000000 |
                                    -(uint)(fVar31 < 0.0) & 0xbf000000) + fVar31);
      bVar10 = 2;
      if (multisample) {
        bVar10 = bVar3;
      }
      lVar12 = uVar8 << (bVar10 & 0x3f);
      bVar10 = 1;
      uVar8 = 0;
      do {
        uVar16 = uVar8;
        if (uVar16 == 3) break;
        uVar8 = uVar16 + 1;
        uVar20 = uVar8 & 0xffffffff;
        if (uVar8 == 3) {
          uVar20 = 0;
        }
        local_208 = (undefined1 *)0x0;
        auStack_200[0] = 0;
        lVar23 = 0;
        do {
          (&local_208)[lVar23] = (undefined1 *)(local_b8[uVar20 * 2 + lVar23] - plVar19[lVar23]);
          lVar23 = lVar23 + 1;
        } while (lVar23 == 1);
        local_1c8 = 0;
        auStack_1c0[0] = 0;
        lVar23 = 0;
        do {
          (&local_1c8)[lVar23] = local_78[lVar23] - plVar19[lVar23];
          lVar23 = lVar23 + 1;
        } while (lVar23 == 1);
        lVar23 = 0;
        lVar21 = auStack_1c0[0] * (long)local_208 - local_1c8 * auStack_200[0];
        if (lVar21 < 0) {
          lVar24 = 0;
          do {
            lVar24 = lVar24 + (long)(&local_208)[lVar23] * (long)(&local_208)[lVar23];
            lVar23 = lVar23 + 1;
          } while (lVar23 == 1);
          lVar24 = lVar24 * lVar12;
          if (lVar21 * lVar21 - lVar24 == 0 || lVar21 * lVar21 < lVar24) goto LAB_01a16231;
          bVar26 = false;
        }
        else {
          lVar24 = 0;
          do {
            lVar24 = lVar24 + (long)(&local_208)[lVar23] * (long)(&local_208)[lVar23];
            lVar23 = lVar23 + 1;
          } while (lVar23 == 1);
          bVar26 = true;
          if (lVar21 * lVar21 < lVar24 * lVar12) {
LAB_01a16231:
            bVar26 = true;
            bVar10 = 0;
          }
        }
        plVar19 = plVar19 + 2;
      } while (bVar26);
      CVar11 = COVERAGE_NONE;
      if (uVar16 >= 3) {
        CVar11 = (uint)(byte)~bVar10 * 2;
      }
      if (!(bool)(uVar16 < 3 | bVar10)) {
        local_b8[0] = (long)iVar1 << (bVar3 & 0x3f);
        local_b8[1] = (long)iVar2 << (bVar3 & 0x3f);
        local_b8[2] = (long)(iVar1 + 1) << (bVar3 & 0x3f);
        local_90 = (long)(iVar2 + 1) << (bVar3 & 0x3f);
        local_78[0] = local_b8[0] + local_268[0];
        local_78[1] = local_b8[1] + local_268[0];
        local_78[2] = local_b8[0] + 1 + local_268[0];
        local_50 = local_b8[1] + 1 + local_268[0];
        local_128 = ZEXT416((uint)fVar29);
        local_148 = ZEXT416((uint)fVar30);
        local_108 = ZEXT416((uint)fVar28);
        local_118 = ZEXT416((uint)fVar31);
        local_138 = ZEXT416((uint)fVar32);
        local_158 = ZEXT416((uint)fVar33);
        local_b8[3] = local_b8[1];
        local_98 = local_b8[2];
        local_88 = local_b8[0];
        local_80 = local_90;
        local_78[3] = local_78[1];
        local_58 = local_78[2];
        local_48 = local_78[0];
        local_40 = local_50;
        fVar31 = floorf(fVar28);
        fVar28 = floorf((float)local_158._0_4_);
        auStack_200[0] = (ulong)(int)fVar28;
        local_208 = (undefined1 *)(long)(int)fVar31;
        fVar31 = floorf((float)local_148._0_4_);
        fVar28 = floorf((float)local_138._0_4_);
        auStack_200[2] = (ulong)(int)fVar28;
        auStack_200[1] = (long)(int)fVar31;
        fVar31 = floorf((float)local_128._0_4_);
        fVar28 = floorf((float)local_118._0_4_);
        local_1e0 = (long)(int)fVar28;
        auStack_200[3] = (long)(int)fVar31;
        fVar31 = ceilf((float)local_108._0_4_);
        fVar28 = ceilf((float)local_158._0_4_);
        auStack_1c0[0] = (ulong)(int)fVar28;
        local_1c8 = (long)(int)fVar31;
        fVar31 = ceilf((float)local_148._0_4_);
        fVar28 = ceilf((float)local_138._0_4_);
        auStack_1c0[2] = (ulong)(int)fVar28;
        auStack_1c0[1] = (long)(int)fVar31;
        fVar31 = ceilf((float)local_128._0_4_);
        fVar28 = ceilf((float)local_118._0_4_);
        auStack_1c0[3] = (long)(int)fVar31;
        local_1a0 = (long)(int)fVar28;
        plVar19 = local_78;
        if (multisample) {
          plVar19 = local_b8;
        }
        local_178 = 0;
        local_f0 = 0;
        CVar14 = CVar11;
        do {
          local_e8 = local_f0 + 1;
          uVar8 = local_e8 & 0xffffffff;
          if (local_e8 == 3) {
            uVar8 = 0;
          }
          local_c8 = &local_208 + local_f0 * 2;
          local_d0 = (undefined1 **)(&local_1c8 + local_f0 * 2);
          local_d8 = auStack_200 + local_f0 * 2;
          local_e0 = auStack_1c0 + local_f0 * 2;
          local_128._0_8_ = &local_208 + uVar8 * 2;
          local_138._0_8_ = &local_1c8 + uVar8 * 2;
          local_148._0_8_ = auStack_200 + uVar8 * 2;
          local_158._0_8_ = auStack_1c0 + uVar8 * 2;
          local_170 = 0;
          local_230 = 0;
          do {
            ppuVar9 = local_c8;
            if ((local_230 & 1) == 0) {
              ppuVar9 = (undefined1 **)(&local_1c8 + local_f0 * 2);
            }
            local_108._0_8_ = local_230;
            uVar27 = (uint)local_230;
            puVar13 = local_d8;
            if (uVar27 < 2) {
              puVar13 = auStack_1c0 + local_f0 * 2;
            }
            local_238 = *ppuVar9;
            local_118._0_8_ = local_238;
            local_230 = *puVar13;
            bVar26 = false;
            uVar7 = 0;
            do {
              ppuVar9 = &local_208 + uVar8 * 2;
              if ((uVar7 & 1) == 0) {
                ppuVar9 = (undefined1 **)(&local_1c8 + uVar8 * 2);
              }
              puVar13 = auStack_200 + uVar8 * 2;
              if (uVar7 < 2) {
                puVar13 = auStack_1c0 + uVar8 * 2;
              }
              local_1d8 = *ppuVar9;
              local_1d0 = *puVar13;
              uVar18 = 1;
              uVar16 = 0;
              plVar22 = plVar19;
              CVar15 = CVar11;
              do {
                uVar20 = uVar16;
                CVar11 = CVar15;
                CVar4 = CVar14;
                if (uVar20 == 4) break;
                uVar6 = (uVar18 & 3) << 4;
                local_268[0] = 0;
                local_268[1] = 0;
                lVar12 = 0;
                do {
                  local_268[lVar12] = (long)(&local_1d8)[lVar12] - (&local_238)[lVar12];
                  lVar12 = lVar12 + 1;
                } while (lVar12 == 1);
                local_258[0] = 0;
                local_258[1] = 0;
                lVar12 = 0;
                do {
                  local_258[lVar12] = plVar22[lVar12] - (&local_238)[lVar12];
                  lVar12 = lVar12 + 1;
                } while (lVar12 == 1);
                local_248 = (undefined1 *)0x0;
                lStack_240 = 0;
                lVar12 = 0;
                do {
                  (&local_248)[lVar12] =
                       (undefined1 *)
                       (*(long *)((long)plVar19 + lVar12 * 8 + (ulong)uVar6) - (&local_238)[lVar12])
                  ;
                  lVar12 = lVar12 + 1;
                } while (lVar12 == 1);
                uVar25 = local_258[1] * local_268[0] - local_258[0] * local_268[1];
                uVar16 = local_268[0] * lStack_240 - local_268[1] * (long)local_248;
                if (((long)(uVar16 & uVar25) < 0) || ((0 < (long)uVar25 && (0 < (long)uVar16)))) {
LAB_01a16734:
                  bVar5 = false;
                }
                else {
                  local_268[0] = 0;
                  local_268[1] = 0;
                  lVar12 = 0;
                  do {
                    local_268[lVar12] =
                         *(long *)((long)plVar19 + lVar12 * 8 + (ulong)uVar6) - plVar22[lVar12];
                    lVar12 = lVar12 + 1;
                  } while (lVar12 == 1);
                  local_258[0] = 0;
                  local_258[1] = 0;
                  lVar12 = 0;
                  do {
                    local_258[lVar12] = (&local_238)[lVar12] - plVar22[lVar12];
                    lVar12 = lVar12 + 1;
                  } while (lVar12 == 1);
                  local_248 = (undefined1 *)0x0;
                  lStack_240 = 0;
                  lVar12 = 0;
                  do {
                    (&local_248)[lVar12] = (&local_1d8)[lVar12] + -plVar22[lVar12];
                    lVar12 = lVar12 + 1;
                  } while (lVar12 == 1);
                  uVar25 = local_258[1] * local_268[0] - local_258[0] * local_268[1];
                  uVar16 = local_268[0] * lStack_240 - local_268[1] * (long)local_248;
                  if ((long)(uVar16 & uVar25) < 0) goto LAB_01a16734;
                  bVar5 = (long)uVar16 < 1 || (long)uVar25 < 1;
                }
                plVar22 = plVar22 + 2;
                uVar18 = (uint)(byte)((char)uVar18 + 1);
                uVar16 = uVar20 + 1;
                CVar11 = COVERAGE_PARTIAL;
                CVar15 = CVar14;
                CVar4 = COVERAGE_PARTIAL;
              } while (!bVar5);
              CVar14 = CVar4;
              if (uVar20 < 4) break;
              bVar26 = 2 < uVar7;
              uVar7 = uVar7 + 1;
            } while (uVar7 != 4);
            if (!bVar26) break;
            local_170 = CONCAT71((int7)(local_230 >> 8),2 < uVar27);
            local_230 = (ulong)(uVar27 + 1);
          } while (uVar27 + 1 != 4);
        } while (((local_170 & 1) != 0) &&
                (local_178 = CONCAT71((int7)(local_230 >> 8),1 < local_f0), local_f0 = local_e8,
                local_e8 != 3));
        if ((local_178 & 1) != 0) {
          ppuVar9 = &local_208;
          uVar8 = 0;
          do {
            if (uVar8 == 3) {
              return COVERAGE_FULL;
            }
            uVar8 = uVar8 + 1;
            uVar16 = uVar8 & 0xffffffff;
            if (uVar8 == 3) {
              uVar16 = 0;
            }
            local_268[0] = 0;
            local_268[1] = 0;
            lVar12 = 0;
            do {
              local_268[lVar12] = (long)(&local_208)[uVar16 * 2 + lVar12] - (long)ppuVar9[lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 == 1);
            local_258[0] = 0;
            local_258[1] = 0;
            lVar12 = 0;
            do {
              local_258[lVar12] = plVar19[lVar12] - (long)(&local_208)[uVar16 * 2 + lVar12];
              lVar12 = lVar12 + 1;
            } while (lVar12 == 1);
            ppuVar9 = ppuVar9 + 2;
            CVar11 = COVERAGE_NONE;
          } while (-1 < (long)(local_258[1] * local_268[0] - local_258[0] * local_268[1]));
        }
      }
    }
  }
  return CVar11;
}

Assistant:

CoverageType calculateTriangleCoverage (const tcu::Vec4& p0, const tcu::Vec4& p1, const tcu::Vec4& p2, const tcu::IVec2& pixel, const tcu::IVec2& viewportSize, int subpixelBits, bool multisample)
{
	typedef tcu::Vector<deInt64, 2> I64Vec2;

	const deUint64		numSubPixels						= ((deUint64)1) << subpixelBits;
	const deUint64		pixelHitBoxSize						= (multisample) ? (numSubPixels) : (2+2);	//!< allow 4 central (2x2) for non-multisample pixels. Rounding may move edges 1 subpixel to any direction.
	const bool			order								= isTriangleClockwise(p0, p1, p2);			//!< clockwise / counter-clockwise
	const tcu::Vec4&	orderedP0							= p0;										//!< vertices of a clockwise triangle
	const tcu::Vec4&	orderedP1							= (order) ? (p1) : (p2);
	const tcu::Vec4&	orderedP2							= (order) ? (p2) : (p1);
	const tcu::Vec2		triangleNormalizedDeviceSpace[3]	=
	{
		tcu::Vec2(orderedP0.x() / orderedP0.w(), orderedP0.y() / orderedP0.w()),
		tcu::Vec2(orderedP1.x() / orderedP1.w(), orderedP1.y() / orderedP1.w()),
		tcu::Vec2(orderedP2.x() / orderedP2.w(), orderedP2.y() / orderedP2.w()),
	};
	const tcu::Vec2		triangleScreenSpace[3]				=
	{
		(triangleNormalizedDeviceSpace[0] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
		(triangleNormalizedDeviceSpace[1] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
		(triangleNormalizedDeviceSpace[2] + tcu::Vec2(1.0f, 1.0f)) * 0.5f * tcu::Vec2((float)viewportSize.x(), (float)viewportSize.y()),
	};

	// Broad bounding box - pixel check
	{
		const float minX = de::min(de::min(triangleScreenSpace[0].x(), triangleScreenSpace[1].x()), triangleScreenSpace[2].x());
		const float minY = de::min(de::min(triangleScreenSpace[0].y(), triangleScreenSpace[1].y()), triangleScreenSpace[2].y());
		const float maxX = de::max(de::max(triangleScreenSpace[0].x(), triangleScreenSpace[1].x()), triangleScreenSpace[2].x());
		const float maxY = de::max(de::max(triangleScreenSpace[0].y(), triangleScreenSpace[1].y()), triangleScreenSpace[2].y());

		if ((float)pixel.x() > maxX + 1 ||
			(float)pixel.y() > maxY + 1 ||
			(float)pixel.x() < minX - 1 ||
			(float)pixel.y() < minY - 1)
			return COVERAGE_NONE;
	}

	// Broad triangle - pixel area intersection
	{
		const I64Vec2 pixelCenterPosition = I64Vec2(pixel.x(), pixel.y()) * I64Vec2(numSubPixels, numSubPixels) + I64Vec2(numSubPixels / 2, numSubPixels / 2);
		const I64Vec2 triangleSubPixelSpaceRound[3] =
		{
			I64Vec2(deRoundFloatToInt32(triangleScreenSpace[0].x() * (float)numSubPixels), deRoundFloatToInt32(triangleScreenSpace[0].y() * (float)numSubPixels)),
			I64Vec2(deRoundFloatToInt32(triangleScreenSpace[1].x() * (float)numSubPixels), deRoundFloatToInt32(triangleScreenSpace[1].y() * (float)numSubPixels)),
			I64Vec2(deRoundFloatToInt32(triangleScreenSpace[2].x() * (float)numSubPixels), deRoundFloatToInt32(triangleScreenSpace[2].y() * (float)numSubPixels)),
		};

		// Check (using cross product) if pixel center is
		// a) too far from any edge
		// b) fully inside all edges
		bool insideAllEdges = true;
		for (int vtxNdx = 0; vtxNdx < 3; ++vtxNdx)
		{
			const int		otherVtxNdx				= (vtxNdx + 1) % 3;
			const deInt64	maxPixelDistanceSquared	= pixelHitBoxSize*pixelHitBoxSize; // Max distance from the pixel center from within the pixel is (sqrt(2) * boxWidth/2). Use 2x value for rounding tolerance
			const I64Vec2	edge					= triangleSubPixelSpaceRound[otherVtxNdx]	- triangleSubPixelSpaceRound[vtxNdx];
			const I64Vec2	v						= pixelCenterPosition						- triangleSubPixelSpaceRound[vtxNdx];
			const deInt64	crossProduct			= (edge.x() * v.y() - edge.y() * v.x());

			// distance from edge: (edge x v) / |edge|
			//     (edge x v) / |edge| > maxPixelDistance
			// ==> (edge x v)^2 / edge^2 > maxPixelDistance^2    | edge x v > 0
			// ==> (edge x v)^2 > maxPixelDistance^2 * edge^2
			if (crossProduct < 0 && crossProduct*crossProduct > maxPixelDistanceSquared * tcu::lengthSquared(edge))
				return COVERAGE_NONE;
			if (crossProduct < 0 || crossProduct*crossProduct < maxPixelDistanceSquared * tcu::lengthSquared(edge))
				insideAllEdges = false;
		}

		if (insideAllEdges)
			return COVERAGE_FULL;
	}

	// Accurate intersection for edge pixels
	{
		//  In multisampling, the sample points can be anywhere in the pixel, and in single sampling only in the center.
		const I64Vec2 pixelCorners[4] =
		{
			I64Vec2((pixel.x()+0) * numSubPixels, (pixel.y()+0) * numSubPixels),
			I64Vec2((pixel.x()+1) * numSubPixels, (pixel.y()+0) * numSubPixels),
			I64Vec2((pixel.x()+1) * numSubPixels, (pixel.y()+1) * numSubPixels),
			I64Vec2((pixel.x()+0) * numSubPixels, (pixel.y()+1) * numSubPixels),
		};
		const I64Vec2 pixelCenterCorners[4] =
		{
			I64Vec2(pixel.x() * numSubPixels + numSubPixels/2 + 0, pixel.y() * numSubPixels + numSubPixels/2 + 0),
			I64Vec2(pixel.x() * numSubPixels + numSubPixels/2 + 1, pixel.y() * numSubPixels + numSubPixels/2 + 0),
			I64Vec2(pixel.x() * numSubPixels + numSubPixels/2 + 1, pixel.y() * numSubPixels + numSubPixels/2 + 1),
			I64Vec2(pixel.x() * numSubPixels + numSubPixels/2 + 0, pixel.y() * numSubPixels + numSubPixels/2 + 1),
		};

		// both rounding directions
		const I64Vec2 triangleSubPixelSpaceFloor[3] =
		{
			I64Vec2(deFloorFloatToInt32(triangleScreenSpace[0].x() * (float)numSubPixels), deFloorFloatToInt32(triangleScreenSpace[0].y() * (float)numSubPixels)),
			I64Vec2(deFloorFloatToInt32(triangleScreenSpace[1].x() * (float)numSubPixels), deFloorFloatToInt32(triangleScreenSpace[1].y() * (float)numSubPixels)),
			I64Vec2(deFloorFloatToInt32(triangleScreenSpace[2].x() * (float)numSubPixels), deFloorFloatToInt32(triangleScreenSpace[2].y() * (float)numSubPixels)),
		};
		const I64Vec2 triangleSubPixelSpaceCeil[3] =
		{
			I64Vec2(deCeilFloatToInt32(triangleScreenSpace[0].x() * (float)numSubPixels), deCeilFloatToInt32(triangleScreenSpace[0].y() * (float)numSubPixels)),
			I64Vec2(deCeilFloatToInt32(triangleScreenSpace[1].x() * (float)numSubPixels), deCeilFloatToInt32(triangleScreenSpace[1].y() * (float)numSubPixels)),
			I64Vec2(deCeilFloatToInt32(triangleScreenSpace[2].x() * (float)numSubPixels), deCeilFloatToInt32(triangleScreenSpace[2].y() * (float)numSubPixels)),
		};
		const I64Vec2* const corners = (multisample) ? (pixelCorners) : (pixelCenterCorners);

		// Test if any edge (with any rounding) intersects the pixel (boundary). If it does => Partial. If not => fully inside or outside

		for (int edgeNdx = 0; edgeNdx < 3; ++edgeNdx)
		for (int startRounding = 0; startRounding < 4; ++startRounding)
		for (int endRounding = 0; endRounding < 4; ++endRounding)
		{
			const int		nextEdgeNdx	= (edgeNdx+1) % 3;
			const I64Vec2	startPos	((startRounding&0x01)	? (triangleSubPixelSpaceFloor[edgeNdx].x())		: (triangleSubPixelSpaceCeil[edgeNdx].x()),		(startRounding&0x02)	? (triangleSubPixelSpaceFloor[edgeNdx].y())		: (triangleSubPixelSpaceCeil[edgeNdx].y()));
			const I64Vec2	endPos		((endRounding&0x01)		? (triangleSubPixelSpaceFloor[nextEdgeNdx].x())	: (triangleSubPixelSpaceCeil[nextEdgeNdx].x()),	(endRounding&0x02)		? (triangleSubPixelSpaceFloor[nextEdgeNdx].y())	: (triangleSubPixelSpaceCeil[nextEdgeNdx].y()));

			for (int pixelEdgeNdx = 0; pixelEdgeNdx < 4; ++pixelEdgeNdx)
			{
				const int pixelEdgeEnd = (pixelEdgeNdx + 1) % 4;

				if (lineLineIntersect(startPos, endPos, corners[pixelEdgeNdx], corners[pixelEdgeEnd]))
					return COVERAGE_PARTIAL;
			}
		}

		// fully inside or outside
		for (int edgeNdx = 0; edgeNdx < 3; ++edgeNdx)
		{
			const int		nextEdgeNdx		= (edgeNdx+1) % 3;
			const I64Vec2&	startPos		= triangleSubPixelSpaceFloor[edgeNdx];
			const I64Vec2&	endPos			= triangleSubPixelSpaceFloor[nextEdgeNdx];
			const I64Vec2	edge			= endPos - startPos;
			const I64Vec2	v				= corners[0] - endPos;
			const deInt64	crossProduct	= (edge.x() * v.y() - edge.y() * v.x());

			// a corner of the pixel is outside => "fully inside" option is impossible
			if (crossProduct < 0)
				return COVERAGE_NONE;
		}

		return COVERAGE_FULL;
	}
}